

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O0

void __thiscall OpenSketch<4U>::Init(OpenSketch<4U> *this,Data<4U> *from,Data<4U> *to)

{
  bool bVar1;
  uint uVar2;
  mapped_type *pmVar3;
  Data<4U> *in_RDX;
  Data<4U> *in_RSI;
  OpenSketch<4U> *in_RDI;
  KV<4U> *kv;
  uint pos;
  int i;
  uint index;
  int min_num;
  Stream<4U> stream;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int iVar4;
  undefined4 in_stack_ffffffffffffff94;
  int iVar5;
  undefined8 in_stack_ffffffffffffff98;
  KV<4U> *pKVar6;
  OpenSketch<4U> *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_40;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_38;
  uint local_30;
  int local_2c;
  uint local_28;
  int local_24;
  Stream<4U> local_20 [2];
  Data<4U> *local_10;
  
  local_10 = in_RSI;
  Stream<4U>::Stream(local_20,in_RSI,in_RDX);
  local_24 = 0x7fffffff;
  uVar2 = Hash::BOBHash32(local_20[0].str + 4,4,0);
  local_28 = uVar2 % *(uint *)&(in_RDI->super_Abstract<4U>).field_0x6c;
  for (local_2c = 0; iVar5 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20), local_2c < 2;
      local_2c = local_2c + 1) {
    uVar2 = Data<4U>::Hash((Data<4U> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                           ,in_stack_ffffffffffffff8c);
    local_30 = uVar2 % (uint)in_RDI->COLUMN;
    bVar1 = BitSet::Get(in_RDI->bitset + local_30,local_28);
    if (!bVar1) {
      in_RDI->counter[local_30] = in_RDI->counter[local_30] + 1;
      BitSet::Set(in_RDI->bitset + local_30,local_28);
    }
    if (in_RDI->counter[local_30] <= local_24) {
      local_24 = in_RDI->counter[local_30];
    }
    in_stack_ffffffffffffffac = local_24;
  }
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
       ::find((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(key_type *)0x11478b)
  ;
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
       ::end((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
              *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = std::__detail::operator!=(&local_38,&local_40);
  if (bVar1) {
    pKVar6 = in_RDI->heap;
    pmVar3 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (key_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
    ;
    if (pKVar6[*pmVar3].first != local_24) {
      pKVar6 = in_RDI->heap;
      iVar5 = local_24;
      pmVar3 = std::
               unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
               ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                             *)CONCAT44(local_24,in_stack_ffffffffffffff90),
                            (key_type *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      pKVar6[*pmVar3].first = iVar5;
      std::
      unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
      ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                    *)CONCAT44(iVar5,in_stack_ffffffffffffff90),
                   (key_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      heap_down(in_RDI,in_stack_ffffffffffffffac);
    }
  }
  else if (in_RDI->heap_num < in_RDI->CAPACITY) {
    Data<4U>::operator=(&in_RDI->heap[in_RDI->heap_num].second,local_10);
    in_RDI->heap[in_RDI->heap_num].first = local_24;
    iVar4 = in_RDI->heap_num;
    in_RDI->heap_num = iVar4 + 1;
    pmVar3 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff94,iVar4),
                          (key_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
    ;
    *pmVar3 = iVar4;
    heap_up(in_stack_ffffffffffffffa0,iVar5);
  }
  else if (in_RDI->heap->first < local_24) {
    pKVar6 = in_RDI->heap;
    std::
    unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
    ::erase((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
            (key_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    Data<4U>::operator=(&pKVar6->second,local_10);
    pKVar6->first = local_24;
    pmVar3 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (key_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
    ;
    *pmVar3 = 0;
    heap_down(in_RDI,in_stack_ffffffffffffffac);
  }
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& from, const Data<DATA_LEN>& to) {
		Stream<DATA_LEN> stream(from, to);

		int min_num = INT_MAX;
		uint index = Hash::BOBHash32(stream.str + DATA_LEN, DATA_LEN) % LENGTH;
		for (int i = 0; i < 2; ++i) {
			uint pos = from.Hash(i) % COLUMN;
			if (!bitset[pos].Get(index)) {
				counter[pos] += 1;
				bitset[pos].Set(index);
			}
			min_num = MIN(min_num, counter[pos]);
		}

		if (mp.find(from) != mp.end()) {
			if (heap[mp[from]].first != min_num) {
				heap[mp[from]].first = min_num;
				heap_down(mp[from]);
			}
		}
		else if (heap_num < CAPACITY) {
			heap[heap_num].second = from;
			heap[heap_num].first = min_num;
			mp[from] = heap_num++;
			heap_up(heap_num - 1);
		}
		else if (min_num > heap[0].first) {
			KV<DATA_LEN>& kv = heap[0];
			mp.erase(kv.second);
			kv.second = from;
			kv.first = min_num;
			mp[from] = 0;
			heap_down(0);
		}
	}